

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O2

ProgramResourceUsage *
deqp::gles31::Functional::getCombinedProgramResourceUsage
          (ProgramResourceUsage *__return_storage_ptr__,Program *program)

{
  int iVar1;
  Shader *shader;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 dVar5;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
  *pvVar6;
  ulong uVar7;
  iterator iVar8;
  mapped_type_conflict *pmVar9;
  int *piVar10;
  _Base_ptr p_Var11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  long lVar13;
  VarType *pVVar14;
  int numComponents;
  Shader *shader_00;
  int iVar15;
  pointer pVVar16;
  ulong uVar17;
  int ndx;
  long lVar18;
  int ndx_1;
  pointer pVVar19;
  bool bVar20;
  int local_dc;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  undefined1 local_74 [12];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> bufferSizes;
  
  __return_storage_ptr__->uniformBufferMaxBinding = -1;
  __return_storage_ptr__->uniformBufferMaxSize = 0;
  __return_storage_ptr__->numUniformBlocks = 0;
  __return_storage_ptr__->numCombinedVertexUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedFragmentUniformComponents = 0;
  __return_storage_ptr__->numCombinedGeometryUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessControlUniformComponents = 0;
  __return_storage_ptr__->numCombinedTessEvalUniformComponents = 0;
  __return_storage_ptr__->shaderStorageBufferMaxBinding = -1;
  __return_storage_ptr__->shaderStorageBufferMaxSize = 0;
  __return_storage_ptr__->numShaderStorageBlocks = 0;
  __return_storage_ptr__->numVaryingComponents = 0;
  __return_storage_ptr__->numVaryingVectors = 0;
  __return_storage_ptr__->numCombinedSamplers = 0;
  __return_storage_ptr__->atomicCounterBufferMaxBinding = -1;
  __return_storage_ptr__->atomicCounterBufferMaxSize = 0;
  __return_storage_ptr__->numAtomicCounterBuffers = 0;
  __return_storage_ptr__->numAtomicCounters = 0;
  __return_storage_ptr__->maxImageBinding = -1;
  __return_storage_ptr__->numCombinedImages = 0;
  __return_storage_ptr__->numCombinedOutputResources = 0;
  __return_storage_ptr__->numXFBInterleavedComponents = 0;
  __return_storage_ptr__->numXFBSeparateAttribs = 0;
  __return_storage_ptr__->numXFBSeparateComponents = 0;
  __return_storage_ptr__->fragmentOutputMaxBinding = -1;
  local_d8 = -1;
  local_d0 = 0;
  local_90 = 0;
  local_98 = 0;
  local_9c = 0;
  local_a0 = 0;
  iVar15 = 0;
  local_cc = 0;
  local_88 = 0;
  local_b8 = 0;
  local_bc = 0;
  local_c0 = 0;
  local_c4 = 0;
  local_c8 = 0;
  local_dc = 0;
  local_d4 = 0;
  local_b0 = 0;
  local_a8 = 0;
  local_ac = 0;
  local_b4 = 0;
  lVar13 = 0;
  local_a4 = local_d8;
  local_94 = local_d8;
  local_8c = local_d8;
  local_84 = local_d8;
  while (pvVar6 = ProgramInterfaceDefinition::Program::getShaders(program),
        lVar13 < (int)((ulong)((long)(pvVar6->
                                     super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar6->
                                    super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pvVar6 = ProgramInterfaceDefinition::Program::getShaders(program);
    shader = (pvVar6->
             super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::Shader_*>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar13];
    iVar2 = anon_unknown_3::getMaxBufferBinding(shader,STORAGE_UNIFORM);
    if (local_d8 <= iVar2) {
      local_d8 = iVar2;
    }
    iVar2 = anon_unknown_3::getBufferMaxSize(shader,STORAGE_UNIFORM);
    if (local_d4 <= iVar2) {
      local_d4 = iVar2;
    }
    iVar2 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_UNIFORM);
    local_74._4_8_ = lVar13;
    switch(shader->m_shaderType) {
    case SHADERTYPE_VERTEX:
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
      local_b8 = local_b8 + iVar3;
      __return_storage_ptr__->numCombinedVertexUniformComponents = local_b8;
      break;
    case SHADERTYPE_FRAGMENT:
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
      local_bc = local_bc + iVar3;
      __return_storage_ptr__->numCombinedFragmentUniformComponents = local_bc;
      break;
    case SHADERTYPE_GEOMETRY:
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
      local_c0 = local_c0 + iVar3;
      __return_storage_ptr__->numCombinedGeometryUniformComponents = local_c0;
      break;
    case SHADERTYPE_TESSELLATION_CONTROL:
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
      local_c4 = local_c4 + iVar3;
      __return_storage_ptr__->numCombinedTessControlUniformComponents = local_c4;
      break;
    case SHADERTYPE_TESSELLATION_EVALUATION:
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_UNIFORM);
      local_c8 = local_c8 + iVar3;
      __return_storage_ptr__->numCombinedTessEvalUniformComponents = local_c8;
    }
    iVar3 = anon_unknown_3::getMaxBufferBinding(shader,STORAGE_BUFFER);
    if (local_8c <= iVar3) {
      local_8c = iVar3;
    }
    __return_storage_ptr__->shaderStorageBufferMaxBinding = local_8c;
    iVar3 = anon_unknown_3::getBufferMaxSize(shader,STORAGE_BUFFER);
    if (local_88 <= iVar3) {
      local_88 = iVar3;
    }
    __return_storage_ptr__->shaderStorageBufferMaxSize = local_88;
    iVar3 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_BUFFER);
    local_cc = local_cc + iVar3;
    __return_storage_ptr__->numShaderStorageBlocks = local_cc;
    if (shader->m_shaderType == SHADERTYPE_FRAGMENT) {
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_IN);
      local_b0 = local_b0 + iVar3;
      iVar3 = anon_unknown_3::getNumVectors(shader,STORAGE_IN);
      local_ac = local_ac + iVar3;
    }
    else if (shader->m_shaderType == SHADERTYPE_VERTEX) {
      iVar3 = anon_unknown_3::getNumComponents(shader,STORAGE_OUT);
      local_b4 = local_b4 + iVar3;
      iVar3 = anon_unknown_3::getNumVectors(shader,STORAGE_OUT);
      local_a8 = local_a8 + iVar3;
    }
    local_dc = local_dc + iVar2;
    shader_00 = (Shader *)0x3;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeSampler);
    iVar15 = iVar15 + iVar2;
    __return_storage_ptr__->numCombinedSamplers = iVar15;
    pVVar19 = (shader->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pVVar16 = (shader->m_defaultBlock).variables.
              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = ((long)pVVar16 - (long)pVVar19) / 0x60;
    uVar17 = uVar7 & 0xffffffff;
    if ((int)uVar7 < 1) {
      uVar17 = 0;
    }
    pVVar14 = &pVVar19->varType;
    iVar2 = -1;
    while (bVar20 = uVar17 != 0, uVar17 = uVar17 - 1, bVar20) {
      bVar20 = anon_unknown_3::containsSubType(pVVar14,(DataType)shader_00);
      if ((bVar20) && (iVar3 = *(int *)((long)&pVVar14[-2].m_data + 0xc), iVar2 <= iVar3)) {
        iVar2 = iVar3;
      }
      pVVar14 = pVVar14 + 4;
    }
    if (local_84 <= iVar2) {
      local_84 = iVar2;
    }
    bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header;
    bufferSizes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->atomicCounterBufferMaxBinding = local_84;
    lVar13 = 0x20;
    bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (lVar18 = 0; lVar18 < (int)(((long)pVVar16 - (long)pVVar19) / 0x60); lVar18 = lVar18 + 1) {
      pVVar14 = (VarType *)((long)&(pVVar19->layout).location + lVar13);
      bVar20 = anon_unknown_3::containsSubType(pVVar14,(DataType)shader_00);
      if (bVar20) {
        local_74._0_4_ = *(ShaderType *)((long)pVVar19 + lVar13 + -0x1c);
        iVar2 = *(int *)((long)pVVar19 + lVar13 + -0x18);
        iVar3 = anon_unknown_3::getNumTypeInstances(pVVar14,glu::isDataTypeAtomicCounter);
        shader_00 = (Shader *)local_74;
        if (iVar2 == -1) {
          iVar2 = 0;
        }
        iVar8 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find(&bufferSizes._M_t,(key_type_conflict *)shader_00);
        iVar2 = iVar2 + iVar3 * 4;
        if ((_Rb_tree_header *)iVar8._M_node == &bufferSizes._M_t._M_impl.super__Rb_tree_header) {
          piVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&bufferSizes,(key_type_conflict *)shader_00);
        }
        else {
          pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](&bufferSizes,(key_type_conflict *)shader_00);
          iVar3 = *pmVar9;
          piVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                    ::operator[](&bufferSizes,(key_type_conflict *)shader_00);
          if (iVar2 < iVar3) {
            iVar2 = iVar3;
          }
        }
        *piVar10 = iVar2;
        pVVar19 = (shader->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pVVar16 = (shader->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      lVar13 = lVar13 + 0x60;
    }
    iVar2 = 0;
    for (p_Var11 = bufferSizes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &bufferSizes._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
      if (iVar2 <= *(int *)&p_Var11[1].field_0x4) {
        iVar2 = *(int *)&p_Var11[1].field_0x4;
      }
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&bufferSizes._M_t);
    if (local_a0 <= iVar2) {
      local_a0 = iVar2;
    }
    __return_storage_ptr__->atomicCounterBufferMaxSize = local_a0;
    iVar2 = anon_unknown_3::getNumAtomicCounterBuffers((anon_unknown_3 *)shader,shader_00);
    local_9c = local_9c + iVar2;
    __return_storage_ptr__->numAtomicCounterBuffers = local_9c;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeAtomicCounter)
    ;
    local_98 = local_98 + iVar2;
    __return_storage_ptr__->numAtomicCounters = local_98;
    lVar13 = 0x20;
    iVar2 = -1;
    for (lVar18 = 0;
        pVVar19 = (shader->m_defaultBlock).variables.
                  super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        lVar18 < (int)(((long)(shader->m_defaultBlock).variables.
                              super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar19) / 0x60);
        lVar18 = lVar18 + 1) {
      iVar3 = *(int *)((long)pVVar19 + lVar13 + -0x1c);
      if (iVar3 == -1) {
        iVar3 = 0;
      }
      iVar4 = anon_unknown_3::getNumTypeInstances
                        ((VarType *)((long)&(pVVar19->layout).location + lVar13),
                         glu::isDataTypeImage);
      iVar3 = iVar4 + iVar3 + -1;
      if (iVar2 <= iVar3) {
        iVar2 = iVar3;
      }
      lVar13 = lVar13 + 0x60;
    }
    if (local_94 <= iVar2) {
      local_94 = iVar2;
    }
    __return_storage_ptr__->maxImageBinding = local_94;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeImage);
    local_90 = local_90 + iVar2;
    __return_storage_ptr__->numCombinedImages = local_90;
    iVar2 = anon_unknown_3::getNumTypeInstances(shader,STORAGE_UNIFORM,glu::isDataTypeImage);
    iVar3 = anon_unknown_3::getNumShaderBlocks(shader,STORAGE_BUFFER);
    local_d0 = iVar3 + local_d0 + iVar2;
    __return_storage_ptr__->numCombinedOutputResources = local_d0;
    if (shader->m_shaderType == SHADERTYPE_FRAGMENT) {
      iVar2 = anon_unknown_3::getNumVectors(shader,STORAGE_OUT);
      local_d0 = iVar2 + local_d0;
      __return_storage_ptr__->numCombinedOutputResources = local_d0;
      pVVar19 = (shader->m_defaultBlock).variables.
                super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = ((long)(shader->m_defaultBlock).variables.
                     super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar19) / 0x60;
      uVar17 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar17 = 0;
      }
      iVar2 = -1;
      for (lVar13 = 0; uVar17 * 0x60 - lVar13 != 0; lVar13 = lVar13 + 0x60) {
        if (*(int *)((long)&pVVar19->storage + lVar13) == 1) {
          iVar3 = 1;
          if (*(int *)((long)&(pVVar19->varType).m_type + lVar13) == 1) {
            iVar3 = *(int *)((long)&(pVVar19->varType).m_data + lVar13 + 8U);
          }
          iVar1 = *(int *)((long)&(pVVar19->layout).location + lVar13);
          iVar4 = iVar1 + -1;
          if (iVar1 == -1) {
            iVar4 = -1;
          }
          if (iVar2 <= iVar4 + iVar3) {
            iVar2 = iVar4 + iVar3;
          }
        }
      }
      if (local_a4 <= iVar2) {
        local_a4 = iVar2;
      }
      __return_storage_ptr__->fragmentOutputMaxBinding = local_a4;
    }
    lVar13 = local_74._4_8_ + 1;
  }
  __return_storage_ptr__->uniformBufferMaxBinding = local_d8;
  __return_storage_ptr__->uniformBufferMaxSize = local_d4;
  __return_storage_ptr__->numUniformBlocks = local_dc;
  dVar5 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
  if (dVar5 == 0x8c8c) {
    lVar13 = 0;
    iVar15 = 0;
    for (lVar18 = 0;
        pvVar12 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program),
        lVar18 < (int)((ulong)((long)(pvVar12->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar12->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5);
        lVar18 = lVar18 + 1) {
      pvVar12 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      iVar2 = anon_unknown_3::getNumFeedbackVaryingComponents
                        (program,(string *)
                                 ((long)&(((pvVar12->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)
                                         ._M_p + lVar13));
      iVar15 = iVar15 + iVar2;
      lVar13 = lVar13 + 0x20;
    }
    __return_storage_ptr__->numXFBInterleavedComponents = iVar15;
  }
  else {
    dVar5 = ProgramInterfaceDefinition::Program::getTransformFeedbackMode(program);
    if (dVar5 == 0x8c8d) {
      pvVar12 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                          (program);
      __return_storage_ptr__->numXFBSeparateAttribs =
           (int)((ulong)((long)(pvVar12->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar12->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5);
      lVar13 = 0;
      iVar15 = 0;
      for (lVar18 = 0;
          pvVar12 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                              (program),
          lVar18 < (int)((ulong)((long)(pvVar12->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar12->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start) >> 5);
          lVar18 = lVar18 + 1) {
        pvVar12 = ProgramInterfaceDefinition::Program::getTransformFeedbackVaryings_abi_cxx11_
                            (program);
        iVar2 = anon_unknown_3::getNumFeedbackVaryingComponents
                          (program,(string *)
                                   ((long)&(((pvVar12->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start)->
                                           _M_dataplus)._M_p + lVar13));
        if (iVar15 <= iVar2) {
          iVar15 = iVar2;
        }
        lVar13 = lVar13 + 0x20;
      }
      __return_storage_ptr__->numXFBSeparateComponents = iVar15;
    }
  }
  if (local_b0 < local_b4) {
    local_b0 = local_b4;
  }
  __return_storage_ptr__->numVaryingComponents = local_b0;
  if (local_ac < local_a8) {
    local_ac = local_a8;
  }
  __return_storage_ptr__->numVaryingVectors = local_ac;
  return __return_storage_ptr__;
}

Assistant:

ProgramInterfaceDefinition::ProgramResourceUsage getCombinedProgramResourceUsage (const ProgramInterfaceDefinition::Program* program)
{
	ProgramInterfaceDefinition::ProgramResourceUsage	retVal;
	int													numVertexOutputComponents	= 0;
	int													numFragmentInputComponents	= 0;
	int													numVertexOutputVectors		= 0;
	int													numFragmentInputVectors		= 0;

	retVal.uniformBufferMaxBinding					= -1; // max binding is inclusive upper bound. Allow 0 bindings by using negative value
	retVal.uniformBufferMaxSize						= 0;
	retVal.numUniformBlocks							= 0;
	retVal.numCombinedVertexUniformComponents		= 0;
	retVal.numCombinedFragmentUniformComponents		= 0;
	retVal.numCombinedGeometryUniformComponents		= 0;
	retVal.numCombinedTessControlUniformComponents	= 0;
	retVal.numCombinedTessEvalUniformComponents		= 0;
	retVal.shaderStorageBufferMaxBinding			= -1; // see above
	retVal.shaderStorageBufferMaxSize				= 0;
	retVal.numShaderStorageBlocks					= 0;
	retVal.numVaryingComponents						= 0;
	retVal.numVaryingVectors						= 0;
	retVal.numCombinedSamplers						= 0;
	retVal.atomicCounterBufferMaxBinding			= -1; // see above
	retVal.atomicCounterBufferMaxSize				= 0;
	retVal.numAtomicCounterBuffers					= 0;
	retVal.numAtomicCounters						= 0;
	retVal.maxImageBinding							= -1; // see above
	retVal.numCombinedImages						= 0;
	retVal.numCombinedOutputResources				= 0;
	retVal.numXFBInterleavedComponents				= 0;
	retVal.numXFBSeparateAttribs					= 0;
	retVal.numXFBSeparateComponents					= 0;
	retVal.fragmentOutputMaxBinding					= -1; // see above

	for (int shaderNdx = 0; shaderNdx < (int)program->getShaders().size(); ++shaderNdx)
	{
		const ProgramInterfaceDefinition::Shader* const shader = program->getShaders()[shaderNdx];

		retVal.uniformBufferMaxBinding		= de::max(retVal.uniformBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_UNIFORM));
		retVal.uniformBufferMaxSize			= de::max(retVal.uniformBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_UNIFORM));
		retVal.numUniformBlocks				+= getNumShaderBlocks(shader, glu::STORAGE_UNIFORM);

		switch (shader->getType())
		{
			case glu::SHADERTYPE_VERTEX:					retVal.numCombinedVertexUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_FRAGMENT:					retVal.numCombinedFragmentUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_GEOMETRY:					retVal.numCombinedGeometryUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_CONTROL:		retVal.numCombinedTessControlUniformComponents	+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			case glu::SHADERTYPE_TESSELLATION_EVALUATION:	retVal.numCombinedTessEvalUniformComponents		+= getNumComponents(shader, glu::STORAGE_UNIFORM); break;
			default: break;
		}

		retVal.shaderStorageBufferMaxBinding	= de::max(retVal.shaderStorageBufferMaxBinding, getMaxBufferBinding(shader, glu::STORAGE_BUFFER));
		retVal.shaderStorageBufferMaxSize		= de::max(retVal.shaderStorageBufferMaxSize, getBufferMaxSize(shader, glu::STORAGE_BUFFER));
		retVal.numShaderStorageBlocks			+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_VERTEX)
		{
			numVertexOutputComponents	+= getNumComponents(shader, glu::STORAGE_OUT);
			numVertexOutputVectors		+= getNumVectors(shader, glu::STORAGE_OUT);
		}
		else if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			numFragmentInputComponents	+= getNumComponents(shader, glu::STORAGE_IN);
			numFragmentInputVectors		+= getNumVectors(shader, glu::STORAGE_IN);
		}

		retVal.numCombinedSamplers	+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeSampler);

		retVal.atomicCounterBufferMaxBinding	= de::max(retVal.atomicCounterBufferMaxBinding, getAtomicCounterMaxBinding(shader));
		retVal.atomicCounterBufferMaxSize		= de::max(retVal.atomicCounterBufferMaxSize, getAtomicCounterMaxBufferSize(shader));
		retVal.numAtomicCounterBuffers			+= getNumAtomicCounterBuffers(shader);
		retVal.numAtomicCounters				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeAtomicCounter);
		retVal.maxImageBinding					= de::max(retVal.maxImageBinding, getUniformMaxBinding(shader, glu::isDataTypeImage));
		retVal.numCombinedImages				+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);

		retVal.numCombinedOutputResources		+= getNumTypeInstances(shader, glu::STORAGE_UNIFORM, glu::isDataTypeImage);
		retVal.numCombinedOutputResources		+= getNumShaderBlocks(shader, glu::STORAGE_BUFFER);

		if (shader->getType() == glu::SHADERTYPE_FRAGMENT)
		{
			retVal.numCombinedOutputResources += getNumVectors(shader, glu::STORAGE_OUT);
			retVal.fragmentOutputMaxBinding = de::max(retVal.fragmentOutputMaxBinding, getFragmentOutputMaxLocation(shader));
		}
	}

	if (program->getTransformFeedbackMode() == GL_INTERLEAVED_ATTRIBS)
		retVal.numXFBInterleavedComponents = getNumXFBComponents(program);
	else if (program->getTransformFeedbackMode() == GL_SEPARATE_ATTRIBS)
	{
		retVal.numXFBSeparateAttribs	= (int)program->getTransformFeedbackVaryings().size();
		retVal.numXFBSeparateComponents	= getNumMaxXFBOutputComponents(program);
	}

	// legacy limits
	retVal.numVaryingComponents	= de::max(numVertexOutputComponents, numFragmentInputComponents);
	retVal.numVaryingVectors	= de::max(numVertexOutputVectors, numFragmentInputVectors);

	return retVal;
}